

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

Type * slang::ast::PackedArrayType::fromSyntax
                 (Scope *scope,Type *elementType,EvaluatedDimension *dimension,SyntaxNode *syntax)

{
  DeferredSourceRange sourceRange;
  bool bVar1;
  PointerIntPair<const_slang::syntax::SyntaxNode_*,_1U,_1U,_bool> this;
  Type *pTVar2;
  SyntaxNode *in_RCX;
  EvaluatedDimension *in_RDX;
  DPIOpenArrayType *in_RSI;
  Scope *in_RDI;
  Scope *in_stack_00000058;
  undefined1 in_stack_00000060 [16];
  DPIOpenArrayType *result;
  DiagCode in_stack_00000074;
  Compilation *comp;
  SyntaxNode *in_stack_ffffffffffffff18;
  Type *in_stack_ffffffffffffff20;
  Type *in_stack_ffffffffffffff28;
  BumpAllocator *in_stack_ffffffffffffff30;
  Type *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffffa0 [16];
  undefined8 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  DPIOpenArrayType *local_8;
  
  this.value = (uintptr_t)Scope::getCompilation(in_RDI);
  bVar1 = Type::isError((Type *)0x487e99);
  local_8 = in_RSI;
  if (!bVar1) {
    bVar1 = Type::isIntegral(in_stack_ffffffffffffff20);
    if (bVar1) {
      bVar1 = EvaluatedDimension::isRange(in_RDX);
      if (bVar1) {
        slang::syntax::DeferredSourceRange::DeferredSourceRange
                  ((DeferredSourceRange *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        sourceRange.range.endLoc._0_4_ = in_stack_ffffffffffffffc8;
        sourceRange.range.startLoc = (SourceLocation)in_stack_ffffffffffffffc0;
        sourceRange.range.endLoc._4_4_ = in_stack_ffffffffffffffcc;
        sourceRange.node.value = this.value;
        local_8 = (DPIOpenArrayType *)
                  fromDim(in_stack_ffffffffffffffa0._0_8_,
                          (Type *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                          in_stack_ffffffffffffffa0._8_8_,sourceRange);
      }
      else if (in_RDX->kind == DPIOpenArray) {
        bVar1 = Type::isPackedArray((Type *)0x487fea);
        if (bVar1) {
          slang::syntax::SyntaxNode::sourceRange
                    ((SyntaxNode *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
          Scope::addDiag(in_stack_00000058,in_stack_00000074,(SourceRange)in_stack_00000060);
          local_8 = (DPIOpenArrayType *)Compilation::getErrorType((Compilation *)this.value);
        }
        else {
          local_8 = BumpAllocator::
                    emplace<slang::ast::DPIOpenArrayType,slang::ast::Type_const&,bool>
                              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                               (bool *)in_stack_ffffffffffffff20);
          Symbol::setSyntax((Symbol *)local_8,in_RCX);
        }
      }
      else {
        local_8 = (DPIOpenArrayType *)Compilation::getErrorType((Compilation *)this.value);
      }
    }
    else {
      pTVar2 = Type::getCanonicalType(in_stack_ffffffffffffff20);
      if ((pTVar2->super_Symbol).kind == DPIOpenArrayType) {
        slang::syntax::SyntaxNode::sourceRange
                  ((SyntaxNode *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        Scope::addDiag(in_stack_00000058,in_stack_00000074,(SourceRange)in_stack_00000060);
      }
      else {
        slang::syntax::SyntaxNode::sourceRange
                  ((SyntaxNode *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        Scope::addDiag(in_stack_00000058,in_stack_00000074,(SourceRange)in_stack_00000060);
        ast::operator<<((Diagnostic *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff68);
      }
      local_8 = (DPIOpenArrayType *)Compilation::getErrorType((Compilation *)this.value);
    }
  }
  return &local_8->super_Type;
}

Assistant:

const Type& PackedArrayType::fromSyntax(const Scope& scope, const Type& elementType,
                                        const EvaluatedDimension& dimension,
                                        const SyntaxNode& syntax) {
    auto& comp = scope.getCompilation();
    if (elementType.isError())
        return elementType;

    if (!elementType.isIntegral()) {
        if (elementType.getCanonicalType().kind == SymbolKind::DPIOpenArrayType)
            scope.addDiag(diag::MultiplePackedOpenArrays, syntax.sourceRange());
        else
            scope.addDiag(diag::PackedArrayNotIntegral, syntax.sourceRange()) << elementType;
        return comp.getErrorType();
    }

    if (!dimension.isRange()) {
        if (dimension.kind == DimensionKind::DPIOpenArray) {
            if (elementType.isPackedArray()) {
                scope.addDiag(diag::MultiplePackedOpenArrays, syntax.sourceRange());
                return comp.getErrorType();
            }

            auto result = comp.emplace<DPIOpenArrayType>(elementType, /* isPacked */ true);
            result->setSyntax(syntax);
            return *result;
        }
        return comp.getErrorType();
    }

    return fromDim(scope, elementType, dimension.range, syntax);
}